

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_is_slice_specifier.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  bool local_32;
  bool local_31;
  bool local_30;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  bool local_20;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  bool local_d [5];
  
  local_d[1] = false;
  local_d[2] = false;
  local_d[3] = false;
  local_d[4] = false;
  local_d[0] = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<int>, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x20,"int main()",(bool *)&std::integral_constant<bool,true>::value,local_d);
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<int[2]>, false_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x23,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_e);
  local_f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<initializer_list<int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x27,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_f);
  local_10 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<initializer_list<int&> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x2a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_10);
  local_11 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<initializer_list<float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x2d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_11);
  local_12 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x31,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_12);
  local_13 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int, unsigned> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x34,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_13);
  local_14 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int&, int&> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x37,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_14);
  local_15 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int&, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x3a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_15);
  local_16 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<float, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x3d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_16);
  local_17 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x40,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_17);
  local_18 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x44,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_18);
  local_19 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int, unsigned> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x47,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_19);
  local_1a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int&, int&> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x4a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1a);
  local_1b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int&, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x4d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1b);
  local_1c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<float, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x50,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1c);
  local_1d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x53,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1d);
  local_1e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<int, 2> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x57,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1e);
  local_1f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<int&, 2> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x5a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_1f);
  local_20 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<float, 2> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x5d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_20);
  local_21 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<int, 3> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x60,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_21);
  local_22 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<all_tag>, true_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,100,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_22);
  local_23 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<int>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x6a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_23);
  local_24 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<float>, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x6d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_24);
  local_25 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<initializer_list<int> >, true_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x71,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_25);
  local_26 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<initializer_list<float> >, false_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x74,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_26);
  local_27 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<pair<int, int> >, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x78,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_27);
  local_28 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<pair<float, float> >, false_type >::value)","true"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x7b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_28);
  local_29 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<tuple<int, int> >, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x7f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_29);
  local_2a = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<tuple<float, float> >, false_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x82,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2a);
  local_2b = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<array<int, 2> >, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x86,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2b);
  local_2c = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<array<float, 2> >, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x89,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2c);
  local_2d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<all_tag>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x8d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2d);
  local_2e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< pack_is_slice_specifiers<>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x93,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2e);
  local_2f = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< pack_is_slice_specifiers<int>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x97,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_2f);
  local_30 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< pack_is_slice_specifiers<float>, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x9a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_30);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(pack_is_slice_specifiers< initializer_list<int> , pair<int, int> , tuple<int, int> , array<int, 2> , all_tag >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0xa2,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_32 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(pack_is_slice_specifiers< initializer_list<int> , pair<int, int> , tuple<int, int> , array<int, 2> , all_tag , float >::value)"
             ,"false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0xab,"int main()",(bool *)&std::integral_constant<bool,false>::value,&local_32);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<int>,    false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<int[2]>, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<initializer_list<int> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<initializer_list<int&> >,  true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<initializer_list<float> >, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int, unsigned> >, true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int&, int&> >,    true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int&, int> >,     true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<float, float> >,  false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int, float> >,    false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int, unsigned> >, true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int&, int&> >,    true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int&, int> >,     true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<float, float> >,  false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int, float> >,    false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<int, 2> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<int&, 2> >,  true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<float, 2> >, false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<int, 3> >,   false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<all_tag>, true_type
    >::value), true);

    ///////////////////////////////////////////////////////////////////////////

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<int>,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<float>, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<initializer_list<int> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<initializer_list<float> >, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<pair<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<pair<float, float> >,  false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<tuple<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<tuple<float, float> >,  false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<array<int, 2> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<array<float, 2> >, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<all_tag>, true_type
    >::value), true);

    ///////////////////////////////////////////////////////////////////////////
    
    BOOST_TEST_EQ((is_convertible<
        pack_is_slice_specifiers<>, true_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        pack_is_slice_specifiers<int>,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        pack_is_slice_specifiers<float>, false_type
    >::value), true);

    BOOST_TEST_EQ((pack_is_slice_specifiers<
        initializer_list<int>
      , pair<int, int>
      , tuple<int, int>
      , array<int, 2>
      , all_tag
    >::value), true);

    BOOST_TEST_EQ((pack_is_slice_specifiers<
        initializer_list<int>
      , pair<int, int>
      , tuple<int, int>
      , array<int, 2>
      , all_tag
      , float
    >::value), false);

    return boost::report_errors();
}